

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFileListGeneratorFixed::Search(cmFileListGeneratorFixed *this,string *parent,cmFileList *lister)

{
  bool bVar1;
  string fullPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,parent,&this->String);
  bVar1 = cmFileListGeneratorBase::Consider(&this->super_cmFileListGeneratorBase,&bStack_38,lister);
  std::__cxx11::string::~string((string *)&bStack_38);
  return bVar1;
}

Assistant:

bool Search(std::string const& parent, cmFileList& lister) override
  {
    std::string fullPath = parent + this->String;
    return this->Consider(fullPath, lister);
  }